

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

BaseFab<double> * __thiscall
amrex::BaseFab<double>::minus<(amrex::RunOn)1>
          (BaseFab<double> *this,BaseFab<double> *src,Box *srcbox,Box *destbox,int srccomp,
          int destcomp,int numcomp)

{
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  BaseFab<double> *in_RDI;
  undefined4 in_R8D;
  Dim3 offset;
  Dim3 slo;
  Dim3 dlo;
  Array4<const_double> *s;
  Array4<double> *d;
  undefined1 local_438 [24];
  anon_class_152_5_d58b1f45 *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbec;
  Box *in_stack_fffffffffffffbf0;
  undefined1 auStack_3f0 [64];
  undefined8 local_3b0;
  int local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  int local_39c;
  int iStack_398;
  int local_394;
  undefined8 local_390;
  int local_388;
  undefined8 local_37c;
  int local_374;
  undefined8 local_370;
  int local_368;
  undefined8 local_360;
  int local_358;
  Array4<const_double> local_350;
  Array4<const_double> *local_310;
  Array4<double> local_308;
  Array4<double> *local_2c8;
  undefined4 local_2bc;
  int *local_2b8;
  int *local_2b0;
  long local_2a8;
  long local_298;
  Dim3 local_288;
  Dim3 local_278;
  Dim3 local_268;
  Dim3 local_258;
  int local_24c;
  Box *local_248;
  double *local_240;
  Dim3 local_238;
  Box *local_228;
  int local_220;
  int iStack_21c;
  int local_218;
  undefined4 local_214;
  Box *local_210;
  undefined4 local_204;
  Box *local_200;
  undefined4 local_1f4;
  Box *local_1f0;
  Dim3 local_1e8;
  Box *local_1d8;
  int local_1d0;
  int iStack_1cc;
  int local_1c8;
  undefined4 local_1c4;
  IntVect *local_1c0;
  undefined4 local_1b4;
  IntVect *local_1b0;
  undefined4 local_1a4;
  IntVect *local_1a0;
  undefined8 local_198;
  int local_190;
  int *local_188;
  int local_180;
  int iStack_17c;
  int local_178;
  undefined4 local_174;
  int *local_170;
  undefined4 local_164;
  int *local_160;
  undefined4 local_154;
  int *local_150;
  undefined8 local_148;
  int local_140;
  int *local_138;
  int local_130;
  int iStack_12c;
  int local_128;
  undefined4 local_124;
  int *local_120;
  undefined4 local_114;
  int *local_110;
  undefined4 local_104;
  int *local_100;
  Dim3 local_f8;
  Dim3 local_e8;
  Dim3 local_d8;
  Dim3 local_c8;
  int local_bc;
  undefined8 *local_b8;
  double *local_b0;
  Dim3 local_a8;
  undefined8 *local_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  int local_88;
  undefined4 local_84;
  undefined8 *local_80;
  undefined4 local_74;
  undefined8 *local_70;
  undefined4 local_64;
  undefined8 *local_60;
  Dim3 local_58;
  undefined8 *local_48;
  int local_40;
  int iStack_3c;
  int local_38;
  undefined4 local_34;
  long local_30;
  undefined4 local_24;
  long local_20;
  undefined4 local_14;
  int *local_10;
  undefined4 *local_8;
  
  local_240 = in_RDI->dptr;
  local_248 = &in_RDI->domain;
  local_24c = in_RDI->nvar;
  local_1f4 = 0;
  local_220 = (local_248->smallend).vect[0];
  local_204 = 1;
  iStack_21c = (in_RDI->domain).smallend.vect[1];
  local_268.x = (local_248->smallend).vect[0];
  local_268.y = (local_248->smallend).vect[1];
  local_214 = 2;
  local_268.z = (in_RDI->domain).smallend.vect[2];
  local_1a0 = &(in_RDI->domain).bigend;
  local_1a4 = 0;
  local_1d0 = local_1a0->vect[0] + 1;
  local_1b0 = &(in_RDI->domain).bigend;
  local_1b4 = 1;
  iStack_1cc = (in_RDI->domain).bigend.vect[1] + 1;
  local_1c0 = &(in_RDI->domain).bigend;
  local_1c4 = 2;
  local_288.z = (in_RDI->domain).bigend.vect[2] + 1;
  local_288.y = iStack_1cc;
  local_288.x = local_1d0;
  local_2bc = in_R8D;
  local_2b8 = in_RCX;
  local_2b0 = in_RDX;
  local_2a8 = in_RSI;
  local_278._0_8_ = local_288._0_8_;
  local_278.z = local_288.z;
  local_258._0_8_ = local_268._0_8_;
  local_258.z = local_268.z;
  local_238._0_8_ = local_268._0_8_;
  local_238.z = local_268.z;
  local_228 = local_248;
  local_218 = local_268.z;
  local_210 = local_248;
  local_200 = local_248;
  local_1f0 = local_248;
  local_1e8._0_8_ = local_288._0_8_;
  local_1e8.z = local_288.z;
  local_1d8 = local_248;
  local_1c8 = local_288.z;
  Array4<double>::Array4(&local_308,local_240,&local_258,&local_278,local_24c);
  local_298 = local_2a8;
  local_b0 = *(double **)(local_2a8 + 0x10);
  local_b8 = (undefined8 *)(local_2a8 + 0x18);
  local_bc = *(int *)(local_2a8 + 0x34);
  local_64 = 0;
  local_90 = *(undefined4 *)local_b8;
  local_74 = 1;
  uStack_8c = *(undefined4 *)(local_2a8 + 0x1c);
  local_d8._0_8_ = *local_b8;
  local_84 = 2;
  local_d8.z = *(int *)(local_2a8 + 0x20);
  local_10 = (int *)(local_2a8 + 0x24);
  local_14 = 0;
  local_40 = *local_10 + 1;
  local_20 = local_2a8 + 0x24;
  local_24 = 1;
  iStack_3c = *(int *)(local_2a8 + 0x28) + 1;
  local_30 = local_2a8 + 0x24;
  local_34 = 2;
  local_f8.z = *(int *)(local_2a8 + 0x2c) + 1;
  local_f8.y = iStack_3c;
  local_f8.x = local_40;
  local_2c8 = &local_308;
  local_e8._0_8_ = local_f8._0_8_;
  local_e8.z = local_f8.z;
  local_c8._0_8_ = local_d8._0_8_;
  local_c8.z = local_d8.z;
  local_a8._0_8_ = local_d8._0_8_;
  local_a8.z = local_d8.z;
  local_98 = local_b8;
  local_88 = local_d8.z;
  local_80 = local_b8;
  local_70 = local_b8;
  local_60 = local_b8;
  local_58._0_8_ = local_f8._0_8_;
  local_58.z = local_f8.z;
  local_48 = local_b8;
  local_38 = local_f8.z;
  Array4<const_double>::Array4(&local_350,local_b0,&local_c8,&local_e8,local_bc);
  local_138 = local_2b8;
  local_100 = local_2b8;
  local_104 = 0;
  local_130 = *local_2b8;
  local_110 = local_2b8;
  local_114 = 1;
  iStack_12c = local_2b8[1];
  local_370 = *(undefined8 *)local_2b8;
  local_120 = local_2b8;
  local_124 = 2;
  local_368 = local_2b8[2];
  local_188 = local_2b0;
  local_150 = local_2b0;
  local_154 = 0;
  local_180 = *local_2b0;
  local_160 = local_2b0;
  local_164 = 1;
  iStack_17c = local_2b0[1];
  local_390 = *(undefined8 *)local_2b0;
  local_170 = local_2b0;
  local_174 = 2;
  local_388 = local_2b0[2];
  local_39c = local_180 - local_130;
  iStack_398 = iStack_17c - iStack_12c;
  local_394 = local_388 - local_368;
  local_3a0 = 1;
  local_8 = &local_3a0;
  local_37c = local_390;
  local_374 = local_388;
  local_360 = local_370;
  local_358 = local_368;
  local_310 = &local_350;
  local_198 = local_390;
  local_190 = local_388;
  local_178 = local_388;
  local_148 = local_370;
  local_140 = local_368;
  local_128 = local_368;
  memcpy(local_438,local_2c8,0x3c);
  memcpy(auStack_3f0,local_310,0x3c);
  local_3b0 = CONCAT44(iStack_398,local_39c);
  local_3a8 = local_394;
  local_3a4 = local_2bc;
  LoopConcurrentOnCpu<amrex::BaseFab<double>::minus<(amrex::RunOn)1>(amrex::BaseFab<double>const&,amrex::Box_const&,amrex::Box_const&,int,int,int)::_lambda(int,int,int,int)_1_>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,in_stack_fffffffffffffbe0);
  return in_RDI;
}

Assistant:

BaseFab<T>&
BaseFab<T>::minus (const BaseFab<T>& src, const Box& srcbox, const Box& destbox,
                   int srccomp, int destcomp, int numcomp) noexcept
{
    BL_ASSERT(destbox.ok());
    BL_ASSERT(src.box().contains(srcbox));
    BL_ASSERT(box().contains(destbox));
    BL_ASSERT(destbox.sameSize(srcbox));
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= src.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= nComp());

    Array4<T> const& d = this->array();
    Array4<T const> const& s = src.const_array();
    const auto dlo = amrex::lbound(destbox);
    const auto slo = amrex::lbound(srcbox);
    const Dim3 offset{slo.x-dlo.x,slo.y-dlo.y,slo.z-dlo.z};
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(run_on, destbox, numcomp, i, j, k, n,
    {
        d(i,j,k,n+destcomp) -= s(i+offset.x,j+offset.y,k+offset.z,n+srccomp);
    });

    return *this;
}